

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O0

void Omega_h::vtk::write_p_data_array2(ostream *stream,string *name,Int ncomps,Int Omega_h_Type)

{
  Int Omega_h_Type_local;
  Int ncomps_local;
  string *name_local;
  ostream *stream_local;
  
  switch(Omega_h_Type) {
  case 0:
    write_p_data_array<signed_char>(stream,name,ncomps);
    break;
  case 2:
    write_p_data_array<int>(stream,name,ncomps);
    break;
  case 3:
    write_p_data_array<long>(stream,name,ncomps);
    break;
  case 5:
    write_p_data_array<double>(stream,name,ncomps);
  }
  return;
}

Assistant:

static void write_p_data_array2(std::ostream& stream, std::string const& name,
    Int ncomps, Int Omega_h_Type) {
  switch (Omega_h_Type) {
    case OMEGA_H_I8:
      write_p_data_array<I8>(stream, name, ncomps);
      break;
    case OMEGA_H_I32:
      write_p_data_array<I32>(stream, name, ncomps);
      break;
    case OMEGA_H_I64:
      write_p_data_array<I64>(stream, name, ncomps);
      break;
    case OMEGA_H_F64:
      write_p_data_array<Real>(stream, name, ncomps);
      break;
  }
}